

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O1

void test_one<std::vector<long,std::allocator<long>>,default_constructor<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>
               (vector<long,_std::allocator<long>_> *numbers,size_t attempt_count,
               default_constructor<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>
               *constructor)

{
  pointer plVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  clock_t cVar4;
  clock_t cVar5;
  ulong uVar6;
  clock_t cVar7;
  __node_base_ptr p_Var8;
  clock_t cVar9;
  ostream *poVar10;
  runtime_error *this;
  __node_base_ptr p_Var11;
  _Hash_node_base *p_Var12;
  size_t sVar13;
  long lVar14;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> set;
  double local_88;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  cVar4 = clock();
  default_constructor<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
  ::operator()((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
               &local_68,constructor,
               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
               (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>)
               (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  cVar5 = clock();
  if (attempt_count == 0) {
    local_88 = 0.0;
  }
  else {
    sVar13 = 0;
    lVar14 = 0;
    do {
      uVar6 = random();
      plVar1 = (numbers->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = uVar6 % (ulong)((long)(numbers->super__Vector_base<long,_std::allocator<long>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar1 >> 3);
      cVar7 = clock();
      p_Var12 = (_Hash_node_base *)plVar1[uVar6];
      p_Var2 = local_68._M_buckets[(ulong)p_Var12 % local_68._M_bucket_count];
      p_Var8 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var8 = p_Var2, p_Var11 = p_Var2->_M_nxt, p_Var12 != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var11->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var8 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % local_68._M_bucket_count !=
               (ulong)p_Var12 % local_68._M_bucket_count) ||
             (p_Var8 = p_Var11, p_Var11 = p_Var3, p_Var12 == p_Var3[1]._M_nxt)) goto LAB_0010bfdd;
        }
        p_Var8 = (__node_base_ptr)0x0;
      }
LAB_0010bfdd:
      if (p_Var8 == (__node_base_ptr)0x0) {
        p_Var12 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var12 = p_Var8->_M_nxt;
      }
      cVar9 = clock();
      if ((p_Var12 == (_Hash_node_base *)0x0) ||
         (p_Var12[1]._M_nxt != (_Hash_node_base *)plVar1[uVar6])) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,anon_var_dwarf_2d551);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar14 = (lVar14 - cVar7) + cVar9;
      sVar13 = sVar13 + 1;
    } while (sVar13 != attempt_count);
    local_88 = (double)lVar14;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_2d56a,0x1e);
  poVar10 = std::ostream::_M_insert<double>((double)(cVar5 - cVar4) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,anon_var_dwarf_2d583,0x29);
  poVar10 = std::ostream::_M_insert<double>
                      ((local_88 /
                       (((double)CONCAT44(0x45300000,(int)(attempt_count >> 0x20)) -
                        1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)attempt_count) - 4503599627370496.0))) /
                       1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void test_one (const Container & numbers, std::size_t attempt_count, const SetConstructor & constructor)
{
    clock_t creation_time = clock();
    auto set = constructor(numbers.begin(), numbers.end());
    creation_time = clock() - creation_time;

    clock_t search_time = 0;
    for (std::size_t attempt = 0; attempt < attempt_count; ++attempt)
    {
        const auto & element = numbers[static_cast<std::size_t>(random()) % numbers.size()];

        clock_t attempt_time = clock();
        auto search_result = set.find(element);
        attempt_time = clock() - attempt_time;

        if (search_result == set.end() || *search_result != element)
        {
            throw std::runtime_error("Нашлись не все искомые элементы.");
        }

        search_time += attempt_time;
    }

    std::cout << "\tВремя создания: " << static_cast<double>(creation_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << "\tСреднее время поиска: " << static_cast<double>(search_time) / static_cast<double>(attempt_count) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}